

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int *piVar2;
  mmk_verify_params local_16d0;
  mmk_verify_params local_16a8;
  mmk_verify_params local_1680;
  mmk_verify_params local_1658;
  mmk_verify_params local_1630;
  mmk_verify_params local_1608;
  mmk_verify_params local_15e0;
  mmk_verify_params local_15b8;
  mmk_verify_params local_1590;
  mmk_verify_params local_1568;
  mmk_verify_params local_1540;
  mmk_verify_params local_1518;
  mmk_verify_params local_14f0;
  mmk_verify_params local_14c8;
  mmk_verify_params local_14a0;
  mmk_verify_params local_1478;
  mmk_verify_params local_1450;
  mmk_verify_params local_1428;
  mmk_verify_params local_1400;
  mmk_verify_params local_13d8;
  mmk_verify_params local_13b0;
  mmk_verify_params local_1388;
  mmk_verify_params local_1360;
  mmk_verify_params local_1338;
  mmk_verify_params local_1310;
  mmk_verify_params local_12e8;
  mmk_verify_params local_12c0;
  mmk_verify_params local_1298;
  mmk_verify_params local_1270;
  mmk_verify_params local_1248;
  mmk_verify_params local_1220;
  mmk_verify_params local_11f8;
  mmk_verify_params local_11d0;
  mmk_verify_params local_11a8;
  mmk_verify_params local_1180;
  mmk_verify_params local_1158;
  mmk_verify_params local_1130;
  mmk_verify_params local_1108;
  mmk_verify_params local_10e0;
  mmk_verify_params local_10b8;
  mmk_verify_params local_1090;
  mmk_verify_params local_1068;
  mmk_verify_params local_1040;
  mmk_verify_params local_1018;
  mmk_verify_params local_ff0;
  mmk_verify_params local_fc8;
  mmk_verify_params local_fa0;
  mmk_verify_params local_f78;
  mmk_verify_params local_f50;
  mmk_verify_params local_f28;
  mmk_verify_params local_f00;
  mmk_verify_params local_ed8;
  mmk_verify_params local_eb0;
  mmk_verify_params local_e88;
  mmk_verify_params local_e60;
  mmk_verify_params local_e38;
  mmk_verify_params local_e10;
  mmk_verify_params local_de8;
  mmk_verify_params local_dc0;
  mmk_verify_params local_d98;
  mmk_verify_params local_d70;
  mmk_verify_params local_d48;
  mmk_verify_params local_d20;
  mmk_verify_params local_cf8;
  mmk_verify_params local_cd0;
  mmk_verify_params local_ca8;
  mmk_verify_params local_c80;
  mmk_verify_params local_c58;
  mmk_verify_params local_c30;
  mmk_verify_params local_c08;
  mmk_verify_params local_be0;
  mmk_verify_params local_bb8;
  mmk_verify_params local_b90;
  mmk_verify_params local_b68;
  mmk_verify_params local_b40;
  mmk_verify_params local_b18;
  mmk_verify_params local_af0;
  mmk_verify_params local_ac8;
  mmk_verify_params local_aa0;
  mmk_verify_params local_a78;
  mmk_verify_params local_a50;
  mmk_verify_params local_a28;
  mmk_verify_params local_a00;
  mmk_verify_params local_9d8;
  mmk_verify_params local_9b0;
  mmk_verify_params local_988;
  mmk_verify_params local_960;
  mmk_verify_params local_938;
  mmk_verify_params local_910;
  mmk_verify_params local_8e8;
  mmk_verify_params local_8c0;
  mmk_verify_params local_898;
  mmk_verify_params local_870;
  mmk_verify_params local_848;
  mmk_verify_params local_820;
  mmk_verify_params local_7f8;
  mmk_verify_params local_7d0;
  mmk_verify_params local_7a8;
  mmk_verify_params local_780;
  mmk_verify_params local_758;
  mmk_verify_params local_730;
  mmk_verify_params local_708;
  mmk_verify_params local_6e0;
  mmk_verify_params local_6b8;
  mmk_verify_params local_690;
  mmk_verify_params local_668;
  mmk_verify_params local_640;
  mmk_verify_params local_618;
  mmk_verify_params local_5f0;
  mmk_verify_params local_5c8;
  mmk_verify_params local_5a0;
  mmk_verify_params local_578;
  mmk_verify_params local_550;
  mmk_verify_params local_528;
  mmk_verify_params local_500;
  mmk_verify_params local_4d8;
  mmk_verify_params local_4b0;
  mmk_verify_params local_488;
  mmk_verify_params local_458;
  mmk_verify_params local_428;
  mmk_verify_params local_3f8;
  mmk_verify_params local_3c8;
  mmk_verify_params local_398;
  mmk_verify_params local_368;
  mmk_verify_params local_338;
  mmk_verify_params local_308;
  mmk_verify_params local_2d8;
  mmk_verify_params local_2a8;
  mmk_verify_params local_278;
  mmk_verify_params local_248;
  mmk_verify_params local_218;
  mmk_verify_params local_1e8;
  mmk_verify_params local_1b8;
  mmk_verify_params local_188;
  mmk_result local_158;
  mmk_result local_138;
  mmk_result local_118;
  mmk_result local_f8;
  mmk_result local_d8;
  mmk_result local_b8;
  mmk_result local_98;
  mmk_result local_78;
  mmk_result local_58;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  mmk_mock_create_internal("fn_vv",mmkuser_fn_vv_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_78.with_va = (mmk_va_info *)0x0;
  local_78.sentinel_ = 0;
  local_78.then_errno = 0;
  local_78.then_return = (void *)0x0;
  local_78.then_call = set_valid;
  mmk_when_init(&local_78);
  fn_vv();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x48);
  mmk_matcher_term();
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_488.at_least = 0;
  local_488.at_most = 0;
  local_488.times = 0;
  local_488.matching = (_func_int_size_t *)0x0;
  local_488.sentinel_ = 1;
  local_488.never = 1;
  iVar1 = mmk_verify_times(&local_488);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"mmk_verify(fn_vv(), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_16d0.sentinel_ = 1;
  local_16d0._4_8_ = 0;
  local_16d0._12_8_ = 0;
  local_16d0.at_most._4_4_ = 0;
  local_16d0.times = 1;
  local_16d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_16d0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"!mmk_verify(fn_vv(), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_16a8.sentinel_ = 1;
  local_16a8.never = 0;
  local_16a8.at_least = 0;
  local_16a8.at_most = 1;
  local_16a8.times = 0;
  local_16a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_16a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"mmk_verify(fn_vv(), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_1680.sentinel_ = 1;
  local_1680.never = 0;
  local_1680.at_least = 1;
  local_1680.at_most = 0;
  local_1680.times = 0;
  local_1680.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1680);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"!mmk_verify(fn_vv(), .at_least = times + 1)");
    mmk_abort();
  }
  fn_vv();
  if (valid == '\0') {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4c
                ,"valid");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1658.sentinel_ = 1;
  local_1658._4_8_ = 0;
  local_1658._12_8_ = 0;
  local_1658.at_most._4_4_ = 0;
  local_1658.times = 1;
  local_1658.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1658);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1630.sentinel_ = 1;
  local_1630.never = 0;
  local_1630.at_least = 1;
  local_1630.at_most = 0;
  local_1630.times = 0;
  local_1630.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1630);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1608.sentinel_ = 1;
  local_1608.never = 0;
  local_1608.at_least = 0;
  local_1608.at_most = 1;
  local_1608.times = 0;
  local_1608.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1608);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_15e0.sentinel_ = 1;
  local_15e0.never = 0;
  local_15e0.at_least = 1;
  local_15e0.at_most = 1;
  local_15e0.times = 0;
  local_15e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15e0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_458.at_least = 0;
  local_458.at_most = 0;
  local_458.times = 0;
  local_458.matching = (_func_int_size_t *)0x0;
  local_458.sentinel_ = 1;
  local_458.never = 1;
  iVar1 = mmk_verify_times(&local_458);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_15b8.sentinel_ = 1;
  local_15b8._4_8_ = 0;
  local_15b8._12_8_ = 0;
  local_15b8.at_most._4_4_ = 0;
  local_15b8.times = 2;
  local_15b8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15b8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1590.sentinel_ = 1;
  local_1590.never = 0;
  local_1590.at_least = 0;
  local_1590.at_most = 2;
  local_1590.times = 0;
  local_1590.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1590);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1568.sentinel_ = 1;
  local_1568.never = 0;
  local_1568.at_least = 2;
  local_1568.at_most = 0;
  local_1568.times = 0;
  local_1568.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1568);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_reset(fn_vv);
  mmk_mock_create_internal("fn_ii",mmkuser_fn_ii_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_158.sentinel_ = 0;
  local_158.then_errno = -0x1010102;
  local_158.then_return = &local_38;
  local_38 = 1;
  local_158.then_call = (_func_void *)0x0;
  local_158.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_158);
  fn_ii(1);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x52);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_138.sentinel_ = 0;
  local_138.then_errno = -0x1010101;
  local_138.then_return = &local_34;
  local_34 = 2;
  local_138.then_call = (_func_void *)0x0;
  local_138.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_138);
  mmk_matcher_add(MMK_MATCHER_EQ,0);
  fn_ii(2);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x53);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_118.sentinel_ = 0;
  local_118.then_errno = -0x1010100;
  local_118.then_return = &local_30;
  local_30 = 3;
  local_118.then_call = (_func_void *)0x0;
  local_118.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_118);
  mmk_matcher_add(MMK_MATCHER_GEQ,1);
  fn_ii(3);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x54);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_f8.sentinel_ = 0;
  local_f8.then_errno = -0x10100ff;
  local_f8.then_return = &local_2c;
  local_2c = 4;
  local_f8.then_call = (_func_void *)0x0;
  local_f8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_f8);
  mmk_matcher_add(MMK_MATCHER_GT,2);
  fn_ii(4);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x55);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_d8.sentinel_ = 0;
  local_d8.then_errno = -0x10100fe;
  local_d8.then_return = &local_28;
  local_28 = 5;
  local_d8.then_call = (_func_void *)0x0;
  local_d8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_d8);
  mmk_matcher_add(MMK_MATCHER_LEQ,3);
  fn_ii(0xfffffffe);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x56);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_b8.sentinel_ = 0;
  local_b8.then_errno = -0x10100fd;
  local_b8.then_return = &local_24;
  local_24 = 6;
  local_b8.then_call = (_func_void *)0x0;
  local_b8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_b8);
  mmk_matcher_add(MMK_MATCHER_LT,4);
  fn_ii(0xfffffffd);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x57);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_98.sentinel_ = 0;
  local_98.then_errno = -0x10100fc;
  local_98.then_return = &local_20;
  local_20 = 7;
  local_98.then_call = (_func_void *)0x0;
  local_98.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_98);
  mmk_matcher_add_fn(MMK_MATCHER_THAT,5,int_eq);
  fn_ii(0);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x58);
  mmk_matcher_term();
  iVar1 = fn_ii(1);
  if (iVar1 == 1) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010102) goto LAB_00102bdc;
  }
  else {
LAB_00102bdc:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5a
                ,"fn_ii(1) == 1 && errno == err");
    mmk_abort();
  }
  iVar1 = fn_ii(2);
  if (iVar1 == 2) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010101) goto LAB_00102c28;
  }
  else {
LAB_00102c28:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5b
                ,"fn_ii(2) == 2 && errno == err + 1");
    mmk_abort();
  }
  iVar1 = fn_ii(3);
  if (iVar1 == 3) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010100) goto LAB_00102c74;
  }
  else {
LAB_00102c74:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5c
                ,"fn_ii(3) == 3 && errno == err + 2");
    mmk_abort();
  }
  iVar1 = fn_ii(4);
  if (iVar1 == 3) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010100) goto LAB_00102cc0;
  }
  else {
LAB_00102cc0:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5d
                ,"fn_ii(4) == 3 && errno == err + 2");
    mmk_abort();
  }
  iVar1 = fn_ii(5);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102d0c;
  }
  else {
LAB_00102d0c:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5e
                ,"fn_ii(5) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(6);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102d58;
  }
  else {
LAB_00102d58:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5f
                ,"fn_ii(6) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(0x7fffffff);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102da4;
  }
  else {
LAB_00102da4:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x60
                ,"fn_ii(INT_MAX) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(0xffffffff);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x61
                ,"fn_ii(-1) == 0");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffe);
  if (iVar1 == 5) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fe) goto LAB_00102e2e;
  }
  else {
LAB_00102e2e:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x62
                ,"fn_ii(-2) == 5 && errno == err + 4");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffd);
  if (iVar1 == 5) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fe) goto LAB_00102e7a;
  }
  else {
LAB_00102e7a:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",99,
                "fn_ii(-3) == 5 && errno == err + 4");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffc);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102ec6;
  }
  else {
LAB_00102ec6:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",100,
                "fn_ii(-4) == 6 && errno == err + 5");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffb);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102f12;
  }
  else {
LAB_00102f12:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x65
                ,"fn_ii(-5) == 6 && errno == err + 5");
    mmk_abort();
  }
  iVar1 = fn_ii(0x80000000);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102f5e;
  }
  else {
LAB_00102f5e:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x66
                ,"fn_ii(INT_MIN) == 6 && errno == err + 5");
    mmk_abort();
  }
  expected_int = 1;
  iVar1 = fn_ii(1);
  if (iVar1 == 7) {
    piVar2 = __errno_location();
    if ((*piVar2 == -0x10100fc) && ((int_eq_called & 1) != 0)) goto LAB_00102fea;
  }
  mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x69,
              "fn_ii(1) == 7 && errno == err + 6 && int_eq_called");
  mmk_abort();
LAB_00102fea:
  int_eq_called = 0;
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1540.sentinel_ = 1;
  local_1540._4_8_ = 0;
  local_1540._12_8_ = 0;
  local_1540.at_most._4_4_ = 0;
  local_1540.times = 0xe;
  local_1540.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1540);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1518.sentinel_ = 1;
  local_1518.never = 0;
  local_1518.at_least = 0xe;
  local_1518.at_most = 0;
  local_1518.times = 0;
  local_1518.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1518);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_14f0.sentinel_ = 1;
  local_14f0.never = 0;
  local_14f0.at_least = 0;
  local_14f0.at_most = 0xe;
  local_14f0.times = 0;
  local_14f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_14f0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_14c8.sentinel_ = 1;
  local_14c8.never = 0;
  local_14c8.at_least = 0xe;
  local_14c8.at_most = 0xe;
  local_14c8.times = 0;
  local_14c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_14c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times, .at_most = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_428.at_least = 0;
  local_428.at_most = 0;
  local_428.times = 0;
  local_428.matching = (_func_int_size_t *)0x0;
  local_428.sentinel_ = 1;
  local_428.never = 1;
  iVar1 = mmk_verify_times(&local_428);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .never = 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_14a0.sentinel_ = 1;
  local_14a0._4_8_ = 0;
  local_14a0._12_8_ = 0;
  local_14a0.at_most._4_4_ = 0;
  local_14a0.times = 0xd;
  local_14a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_14a0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1478.sentinel_ = 1;
  local_1478.never = 0;
  local_1478.at_least = 0xd;
  local_1478.at_most = 0;
  local_1478.times = 0;
  local_1478.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1478);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1450.sentinel_ = 1;
  local_1450.never = 0;
  local_1450.at_least = 0;
  local_1450.at_most = 0xd;
  local_1450.times = 0;
  local_1450.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1450);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1428.sentinel_ = 1;
  local_1428._4_8_ = 0;
  local_1428._12_8_ = 0;
  local_1428.at_most._4_4_ = 0;
  local_1428.times = 0xf;
  local_1428.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1428);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1400.sentinel_ = 1;
  local_1400.never = 0;
  local_1400.at_least = 0;
  local_1400.at_most = 0xf;
  local_1400.times = 0;
  local_1400.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1400);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_13d8.sentinel_ = 1;
  local_13d8.never = 0;
  local_13d8.at_least = 0xf;
  local_13d8.at_most = 0;
  local_13d8.times = 0;
  local_13d8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_13d8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_13b0.sentinel_ = 1;
  local_13b0._4_8_ = 0;
  local_13b0._12_8_ = 0;
  local_13b0.at_most._4_4_ = 0;
  local_13b0.times = 2;
  local_13b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_13b0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1388.sentinel_ = 1;
  local_1388.never = 0;
  local_1388.at_least = 2;
  local_1388.at_most = 0;
  local_1388.times = 0;
  local_1388.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1388);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1360.sentinel_ = 1;
  local_1360.never = 0;
  local_1360.at_least = 0;
  local_1360.at_most = 2;
  local_1360.times = 0;
  local_1360.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1360);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1338.sentinel_ = 1;
  local_1338.never = 0;
  local_1338.at_least = 2;
  local_1338.at_most = 2;
  local_1338.times = 0;
  local_1338.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1338);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_3f8.at_least = 0;
  local_3f8.at_most = 0;
  local_3f8.times = 0;
  local_3f8.matching = (_func_int_size_t *)0x0;
  local_3f8.sentinel_ = 1;
  local_3f8.never = 1;
  iVar1 = mmk_verify_times(&local_3f8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1310.sentinel_ = 1;
  local_1310._4_8_ = 0;
  local_1310._12_8_ = 0;
  local_1310.at_most._4_4_ = 0;
  local_1310.times = 1;
  local_1310.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1310);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .times = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_12e8.sentinel_ = 1;
  local_12e8.never = 0;
  local_12e8.at_least = 1;
  local_12e8.at_most = 0;
  local_12e8.times = 0;
  local_12e8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_12e8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_12c0.sentinel_ = 1;
  local_12c0.never = 0;
  local_12c0.at_least = 0;
  local_12c0.at_most = 1;
  local_12c0.times = 0;
  local_12c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_12c0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .at_most = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1298.sentinel_ = 1;
  local_1298._4_8_ = 0;
  local_1298._12_8_ = 0;
  local_1298.at_most._4_4_ = 0;
  local_1298.times = 3;
  local_1298.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1298);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1270.sentinel_ = 1;
  local_1270.never = 0;
  local_1270.at_least = 0;
  local_1270.at_most = 3;
  local_1270.times = 0;
  local_1270.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1270);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1248.sentinel_ = 1;
  local_1248.never = 0;
  local_1248.at_least = 3;
  local_1248.at_most = 0;
  local_1248.times = 0;
  local_1248.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1248);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1220.sentinel_ = 1;
  local_1220._4_8_ = 0;
  local_1220._12_8_ = 0;
  local_1220.at_most._4_4_ = 0;
  local_1220.times = 1;
  local_1220.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1220);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_11f8.sentinel_ = 1;
  local_11f8.never = 0;
  local_11f8.at_least = 1;
  local_11f8.at_most = 0;
  local_11f8.times = 0;
  local_11f8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_11f8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_11d0.sentinel_ = 1;
  local_11d0.never = 0;
  local_11d0.at_least = 0;
  local_11d0.at_most = 1;
  local_11d0.times = 0;
  local_11d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_11d0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_11a8.sentinel_ = 1;
  local_11a8.never = 0;
  local_11a8.at_least = 1;
  local_11a8.at_most = 1;
  local_11a8.times = 0;
  local_11a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_11a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_3c8.at_least = 0;
  local_3c8.at_most = 0;
  local_3c8.times = 0;
  local_3c8.matching = (_func_int_size_t *)0x0;
  local_3c8.sentinel_ = 1;
  local_3c8.never = 1;
  iVar1 = mmk_verify_times(&local_3c8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1180.sentinel_ = 1;
  local_1180._4_8_ = 0;
  local_1180._12_8_ = 0;
  local_1180.at_most._4_4_ = 0;
  local_1180.times = 2;
  local_1180.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1180);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1158.sentinel_ = 1;
  local_1158.never = 0;
  local_1158.at_least = 0;
  local_1158.at_most = 2;
  local_1158.times = 0;
  local_1158.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1158);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1130.sentinel_ = 1;
  local_1130.never = 0;
  local_1130.at_least = 2;
  local_1130.at_most = 0;
  local_1130.times = 0;
  local_1130.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1130);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_1108.sentinel_ = 1;
  local_1108._4_8_ = 0;
  local_1108._12_8_ = 0;
  local_1108.at_most._4_4_ = 0;
  local_1108.times = 1;
  local_1108.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1108);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_10e0.sentinel_ = 1;
  local_10e0.never = 0;
  local_10e0.at_least = 1;
  local_10e0.at_most = 0;
  local_10e0.times = 0;
  local_10e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10e0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_10b8.sentinel_ = 1;
  local_10b8.never = 0;
  local_10b8.at_least = 0;
  local_10b8.at_most = 1;
  local_10b8.times = 0;
  local_10b8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10b8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_1090.sentinel_ = 1;
  local_1090.never = 0;
  local_1090.at_least = 1;
  local_1090.at_most = 1;
  local_1090.times = 0;
  local_1090.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1090);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_398.at_least = 0;
  local_398.at_most = 0;
  local_398.times = 0;
  local_398.matching = (_func_int_size_t *)0x0;
  local_398.sentinel_ = 1;
  local_398.never = 1;
  iVar1 = mmk_verify_times(&local_398);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_1068.sentinel_ = 1;
  local_1068._4_8_ = 0;
  local_1068._12_8_ = 0;
  local_1068.at_most._4_4_ = 0;
  local_1068.times = 2;
  local_1068.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1068);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_1040.sentinel_ = 1;
  local_1040.never = 0;
  local_1040.at_least = 0;
  local_1040.at_most = 2;
  local_1040.times = 0;
  local_1040.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1040);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_1018.sentinel_ = 1;
  local_1018.never = 0;
  local_1018.at_least = 2;
  local_1018.at_most = 0;
  local_1018.times = 0;
  local_1018.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1018);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_ff0.sentinel_ = 1;
  local_ff0._4_8_ = 0;
  local_ff0._12_8_ = 0;
  local_ff0.at_most._4_4_ = 0;
  local_ff0.times = 1;
  local_ff0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ff0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_fc8.sentinel_ = 1;
  local_fc8.never = 0;
  local_fc8.at_least = 1;
  local_fc8.at_most = 0;
  local_fc8.times = 0;
  local_fc8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_fc8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_fa0.sentinel_ = 1;
  local_fa0.never = 0;
  local_fa0.at_least = 0;
  local_fa0.at_most = 1;
  local_fa0.times = 0;
  local_fa0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_fa0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_f78.sentinel_ = 1;
  local_f78.never = 0;
  local_f78.at_least = 1;
  local_f78.at_most = 1;
  local_f78.times = 0;
  local_f78.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f78);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_368.at_least = 0;
  local_368.at_most = 0;
  local_368.times = 0;
  local_368.matching = (_func_int_size_t *)0x0;
  local_368.sentinel_ = 1;
  local_368.never = 1;
  iVar1 = mmk_verify_times(&local_368);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_f50.sentinel_ = 1;
  local_f50._4_8_ = 0;
  local_f50._12_8_ = 0;
  local_f50.at_most._4_4_ = 0;
  local_f50.times = 2;
  local_f50.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f50);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_f28.sentinel_ = 1;
  local_f28.never = 0;
  local_f28.at_least = 0;
  local_f28.at_most = 2;
  local_f28.times = 0;
  local_f28.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f28);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_f00.sentinel_ = 1;
  local_f00.never = 0;
  local_f00.at_least = 2;
  local_f00.at_most = 0;
  local_f00.times = 0;
  local_f00.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f00);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_ed8.sentinel_ = 1;
  local_ed8._4_8_ = 0;
  local_ed8._12_8_ = 0;
  local_ed8.at_most._4_4_ = 0;
  local_ed8.times = 1;
  local_ed8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ed8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_eb0.sentinel_ = 1;
  local_eb0.never = 0;
  local_eb0.at_least = 1;
  local_eb0.at_most = 0;
  local_eb0.times = 0;
  local_eb0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_eb0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_e88.sentinel_ = 1;
  local_e88.never = 0;
  local_e88.at_least = 0;
  local_e88.at_most = 1;
  local_e88.times = 0;
  local_e88.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e88);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_e60.sentinel_ = 1;
  local_e60.never = 0;
  local_e60.at_least = 1;
  local_e60.at_most = 1;
  local_e60.times = 0;
  local_e60.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e60);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_338.at_least = 0;
  local_338.at_most = 0;
  local_338.times = 0;
  local_338.matching = (_func_int_size_t *)0x0;
  local_338.sentinel_ = 1;
  local_338.never = 1;
  iVar1 = mmk_verify_times(&local_338);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_e38.sentinel_ = 1;
  local_e38._4_8_ = 0;
  local_e38._12_8_ = 0;
  local_e38.at_most._4_4_ = 0;
  local_e38.times = 2;
  local_e38.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e38);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_e10.sentinel_ = 1;
  local_e10.never = 0;
  local_e10.at_least = 0;
  local_e10.at_most = 2;
  local_e10.times = 0;
  local_e10.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e10);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_de8.sentinel_ = 1;
  local_de8.never = 0;
  local_de8.at_least = 2;
  local_de8.at_most = 0;
  local_de8.times = 0;
  local_de8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_de8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_dc0.sentinel_ = 1;
  local_dc0._4_8_ = 0;
  local_dc0._12_8_ = 0;
  local_dc0.at_most._4_4_ = 0;
  local_dc0.times = 1;
  local_dc0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_dc0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_d98.sentinel_ = 1;
  local_d98.never = 0;
  local_d98.at_least = 1;
  local_d98.at_most = 0;
  local_d98.times = 0;
  local_d98.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d98);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_d70.sentinel_ = 1;
  local_d70.never = 0;
  local_d70.at_least = 0;
  local_d70.at_most = 1;
  local_d70.times = 0;
  local_d70.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d70);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_d48.sentinel_ = 1;
  local_d48.never = 0;
  local_d48.at_least = 1;
  local_d48.at_most = 1;
  local_d48.times = 0;
  local_d48.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d48);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_308.at_least = 0;
  local_308.at_most = 0;
  local_308.times = 0;
  local_308.matching = (_func_int_size_t *)0x0;
  local_308.sentinel_ = 1;
  local_308.never = 1;
  iVar1 = mmk_verify_times(&local_308);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_d20.sentinel_ = 1;
  local_d20._4_8_ = 0;
  local_d20._12_8_ = 0;
  local_d20.at_most._4_4_ = 0;
  local_d20.times = 2;
  local_d20.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d20);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_cf8.sentinel_ = 1;
  local_cf8.never = 0;
  local_cf8.at_least = 0;
  local_cf8.at_most = 2;
  local_cf8.times = 0;
  local_cf8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_cf8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_cd0.sentinel_ = 1;
  local_cd0.never = 0;
  local_cd0.at_least = 2;
  local_cd0.at_most = 0;
  local_cd0.times = 0;
  local_cd0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_cd0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_ca8.sentinel_ = 1;
  local_ca8._4_8_ = 0;
  local_ca8._12_8_ = 0;
  local_ca8.at_most._4_4_ = 0;
  local_ca8.times = 1;
  local_ca8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ca8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_c80.sentinel_ = 1;
  local_c80.never = 0;
  local_c80.at_least = 1;
  local_c80.at_most = 0;
  local_c80.times = 0;
  local_c80.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c80);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_c58.sentinel_ = 1;
  local_c58.never = 0;
  local_c58.at_least = 0;
  local_c58.at_most = 1;
  local_c58.times = 0;
  local_c58.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c58);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_c30.sentinel_ = 1;
  local_c30.never = 0;
  local_c30.at_least = 1;
  local_c30.at_most = 1;
  local_c30.times = 0;
  local_c30.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c30);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_2d8.at_least = 0;
  local_2d8.at_most = 0;
  local_2d8.times = 0;
  local_2d8.matching = (_func_int_size_t *)0x0;
  local_2d8.sentinel_ = 1;
  local_2d8.never = 1;
  iVar1 = mmk_verify_times(&local_2d8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_c08.sentinel_ = 1;
  local_c08._4_8_ = 0;
  local_c08._12_8_ = 0;
  local_c08.at_most._4_4_ = 0;
  local_c08.times = 2;
  local_c08.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c08);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_be0.sentinel_ = 1;
  local_be0.never = 0;
  local_be0.at_least = 0;
  local_be0.at_most = 2;
  local_be0.times = 0;
  local_be0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_be0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_bb8.sentinel_ = 1;
  local_bb8.never = 0;
  local_bb8.at_least = 2;
  local_bb8.at_most = 0;
  local_bb8.times = 0;
  local_bb8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_bb8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_b90.sentinel_ = 1;
  local_b90._4_8_ = 0;
  local_b90._12_8_ = 0;
  local_b90.at_most._4_4_ = 0;
  local_b90.times = 1;
  local_b90.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b90);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_b68.sentinel_ = 1;
  local_b68.never = 0;
  local_b68.at_least = 1;
  local_b68.at_most = 0;
  local_b68.times = 0;
  local_b68.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b68);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_b40.sentinel_ = 1;
  local_b40.never = 0;
  local_b40.at_least = 0;
  local_b40.at_most = 1;
  local_b40.times = 0;
  local_b40.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b40);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_b18.sentinel_ = 1;
  local_b18.never = 0;
  local_b18.at_least = 1;
  local_b18.at_most = 1;
  local_b18.times = 0;
  local_b18.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b18);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_2a8.at_least = 0;
  local_2a8.at_most = 0;
  local_2a8.times = 0;
  local_2a8.matching = (_func_int_size_t *)0x0;
  local_2a8.sentinel_ = 1;
  local_2a8.never = 1;
  iVar1 = mmk_verify_times(&local_2a8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_af0.sentinel_ = 1;
  local_af0._4_8_ = 0;
  local_af0._12_8_ = 0;
  local_af0.at_most._4_4_ = 0;
  local_af0.times = 2;
  local_af0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_af0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_ac8.sentinel_ = 1;
  local_ac8.never = 0;
  local_ac8.at_least = 0;
  local_ac8.at_most = 2;
  local_ac8.times = 0;
  local_ac8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ac8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_aa0.sentinel_ = 1;
  local_aa0.never = 0;
  local_aa0.at_least = 2;
  local_aa0.at_most = 0;
  local_aa0.times = 0;
  local_aa0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_aa0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_a78.sentinel_ = 1;
  local_a78._4_8_ = 0;
  local_a78._12_8_ = 0;
  local_a78.at_most._4_4_ = 0;
  local_a78.times = 1;
  local_a78.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a78);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_a50.sentinel_ = 1;
  local_a50.never = 0;
  local_a50.at_least = 1;
  local_a50.at_most = 0;
  local_a50.times = 0;
  local_a50.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a50);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_a28.sentinel_ = 1;
  local_a28.never = 0;
  local_a28.at_least = 0;
  local_a28.at_most = 1;
  local_a28.times = 0;
  local_a28.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a28);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_a00.sentinel_ = 1;
  local_a00.never = 0;
  local_a00.at_least = 1;
  local_a00.at_most = 1;
  local_a00.times = 0;
  local_a00.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a00);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_278.at_least = 0;
  local_278.at_most = 0;
  local_278.times = 0;
  local_278.matching = (_func_int_size_t *)0x0;
  local_278.sentinel_ = 1;
  local_278.never = 1;
  iVar1 = mmk_verify_times(&local_278);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_9d8.sentinel_ = 1;
  local_9d8._4_8_ = 0;
  local_9d8._12_8_ = 0;
  local_9d8.at_most._4_4_ = 0;
  local_9d8.times = 2;
  local_9d8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_9d8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_9b0.sentinel_ = 1;
  local_9b0.never = 0;
  local_9b0.at_least = 0;
  local_9b0.at_most = 2;
  local_9b0.times = 0;
  local_9b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_9b0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_988.sentinel_ = 1;
  local_988.never = 0;
  local_988.at_least = 2;
  local_988.at_most = 0;
  local_988.times = 0;
  local_988.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_988);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_960.sentinel_ = 1;
  local_960._4_8_ = 0;
  local_960._12_8_ = 0;
  local_960.at_most._4_4_ = 0;
  local_960.times = 1;
  local_960.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_960);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_938.sentinel_ = 1;
  local_938.never = 0;
  local_938.at_least = 1;
  local_938.at_most = 0;
  local_938.times = 0;
  local_938.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_938);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_910.sentinel_ = 1;
  local_910.never = 0;
  local_910.at_least = 0;
  local_910.at_most = 1;
  local_910.times = 0;
  local_910.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_910);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_8e8.sentinel_ = 1;
  local_8e8.never = 0;
  local_8e8.at_least = 1;
  local_8e8.at_most = 1;
  local_8e8.times = 0;
  local_8e8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_8e8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_248.at_least = 0;
  local_248.at_most = 0;
  local_248.times = 0;
  local_248.matching = (_func_int_size_t *)0x0;
  local_248.sentinel_ = 1;
  local_248.never = 1;
  iVar1 = mmk_verify_times(&local_248);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_8c0.sentinel_ = 1;
  local_8c0._4_8_ = 0;
  local_8c0._12_8_ = 0;
  local_8c0.at_most._4_4_ = 0;
  local_8c0.times = 2;
  local_8c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_8c0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_898.sentinel_ = 1;
  local_898.never = 0;
  local_898.at_least = 0;
  local_898.at_most = 2;
  local_898.times = 0;
  local_898.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_898);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_870.sentinel_ = 1;
  local_870.never = 0;
  local_870.at_least = 2;
  local_870.at_most = 0;
  local_870.times = 0;
  local_870.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_870);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_848.sentinel_ = 1;
  local_848._4_8_ = 0;
  local_848._12_8_ = 0;
  local_848.at_most._4_4_ = 0;
  local_848.times = 1;
  local_848.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_848);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_820.sentinel_ = 1;
  local_820.never = 0;
  local_820.at_least = 1;
  local_820.at_most = 0;
  local_820.times = 0;
  local_820.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_820);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_7f8.sentinel_ = 1;
  local_7f8.never = 0;
  local_7f8.at_least = 0;
  local_7f8.at_most = 1;
  local_7f8.times = 0;
  local_7f8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_7f8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_7d0.sentinel_ = 1;
  local_7d0.never = 0;
  local_7d0.at_least = 1;
  local_7d0.at_most = 1;
  local_7d0.times = 0;
  local_7d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_7d0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_218.at_least = 0;
  local_218.at_most = 0;
  local_218.times = 0;
  local_218.matching = (_func_int_size_t *)0x0;
  local_218.sentinel_ = 1;
  local_218.never = 1;
  iVar1 = mmk_verify_times(&local_218);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_7a8.sentinel_ = 1;
  local_7a8._4_8_ = 0;
  local_7a8._12_8_ = 0;
  local_7a8.at_most._4_4_ = 0;
  local_7a8.times = 2;
  local_7a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_7a8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_780.sentinel_ = 1;
  local_780.never = 0;
  local_780.at_least = 0;
  local_780.at_most = 2;
  local_780.times = 0;
  local_780.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_780);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_758.sentinel_ = 1;
  local_758.never = 0;
  local_758.at_least = 2;
  local_758.at_most = 0;
  local_758.times = 0;
  local_758.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_758);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_730.sentinel_ = 1;
  local_730._4_8_ = 0;
  local_730._12_8_ = 0;
  local_730.at_most._4_4_ = 0;
  local_730.times = 1;
  local_730.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_730);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_708.sentinel_ = 1;
  local_708.never = 0;
  local_708.at_least = 1;
  local_708.at_most = 0;
  local_708.times = 0;
  local_708.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_708);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_6e0.sentinel_ = 1;
  local_6e0.never = 0;
  local_6e0.at_least = 0;
  local_6e0.at_most = 1;
  local_6e0.times = 0;
  local_6e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6e0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_6b8.sentinel_ = 1;
  local_6b8.never = 0;
  local_6b8.at_least = 1;
  local_6b8.at_most = 1;
  local_6b8.times = 0;
  local_6b8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6b8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_1e8.at_least = 0;
  local_1e8.at_most = 0;
  local_1e8.times = 0;
  local_1e8.matching = (_func_int_size_t *)0x0;
  local_1e8.sentinel_ = 1;
  local_1e8.never = 1;
  iVar1 = mmk_verify_times(&local_1e8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_690.sentinel_ = 1;
  local_690._4_8_ = 0;
  local_690._12_8_ = 0;
  local_690.at_most._4_4_ = 0;
  local_690.times = 2;
  local_690.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_690);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_668.sentinel_ = 1;
  local_668.never = 0;
  local_668.at_least = 0;
  local_668.at_most = 2;
  local_668.times = 0;
  local_668.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_668);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_640.sentinel_ = 1;
  local_640.never = 0;
  local_640.at_least = 2;
  local_640.at_most = 0;
  local_640.times = 0;
  local_640.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_640);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_618.sentinel_ = 1;
  local_618._4_8_ = 0;
  local_618._12_8_ = 0;
  local_618.at_most._4_4_ = 0;
  local_618.times = 1;
  local_618.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_618);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_5f0.sentinel_ = 1;
  local_5f0.never = 0;
  local_5f0.at_least = 1;
  local_5f0.at_most = 0;
  local_5f0.times = 0;
  local_5f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_5f0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_5c8.sentinel_ = 1;
  local_5c8.never = 0;
  local_5c8.at_least = 0;
  local_5c8.at_most = 1;
  local_5c8.times = 0;
  local_5c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_5c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_5a0.sentinel_ = 1;
  local_5a0.never = 0;
  local_5a0.at_least = 1;
  local_5a0.at_most = 1;
  local_5a0.times = 0;
  local_5a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_5a0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_1b8.at_least = 0;
  local_1b8.at_most = 0;
  local_1b8.times = 0;
  local_1b8.matching = (_func_int_size_t *)0x0;
  local_1b8.sentinel_ = 1;
  local_1b8.never = 1;
  iVar1 = mmk_verify_times(&local_1b8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_578.sentinel_ = 1;
  local_578._4_8_ = 0;
  local_578._12_8_ = 0;
  local_578.at_most._4_4_ = 0;
  local_578.times = 2;
  local_578.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_578);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_550.sentinel_ = 1;
  local_550.never = 0;
  local_550.at_least = 0;
  local_550.at_most = 2;
  local_550.times = 0;
  local_550.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_550);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_528.sentinel_ = 1;
  local_528.never = 0;
  local_528.at_least = 2;
  local_528.at_most = 0;
  local_528.times = 0;
  local_528.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_528);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_188.at_least = 0;
  local_188.at_most = 0;
  local_188.times = 0;
  local_188.matching = (_func_int_size_t *)0x0;
  local_188.sentinel_ = 1;
  local_188.never = 1;
  iVar1 = mmk_verify_times(&local_188);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"mmk_verify(fn_ii(12), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_500.sentinel_ = 1;
  local_500._4_8_ = 0;
  local_500._12_8_ = 0;
  local_500.at_most._4_4_ = 0;
  local_500.times = 1;
  local_500.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_500);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"!mmk_verify(fn_ii(12), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_4d8.sentinel_ = 1;
  local_4d8.never = 0;
  local_4d8.at_least = 0;
  local_4d8.at_most = 1;
  local_4d8.times = 0;
  local_4d8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_4d8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"mmk_verify(fn_ii(12), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_4b0.sentinel_ = 1;
  local_4b0.never = 0;
  local_4b0.at_least = 1;
  local_4b0.at_most = 0;
  local_4b0.times = 0;
  local_4b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_4b0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"!mmk_verify(fn_ii(12), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_reset(fn_ii);
  mmk_mock_create_internal("fn_ii_va",mmkuser_fn_ii_va_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_58.sentinel_ = 0;
  local_58.then_errno = 0;
  local_58.then_call = (_func_void *)0x0;
  local_58.with_va = (mmk_va_info *)0x0;
  local_58.then_return = &local_1c;
  local_1c = 1;
  mmk_when_init(&local_58);
  fn_ii_va(1,0x2a);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7f);
  mmk_matcher_term();
  iVar1 = fn_ii_va(1,0x2a);
  if (iVar1 != 1) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x81
                ,"fn_ii_va(1, 42) == 1");
    mmk_abort();
  }
  mmk_reset(fn_ii_va);
  return 0;
}

Assistant:

int main(void)
{
    mmk_mock("fn_vv", fn_vv_mock);
    mmk_when(fn_vv(), .then_call = (mmk_fn) set_valid);

    check_called_exact(fn_vv(), 0);
    fn_vv();
    mmk_assert(valid);
    check_called_exact(fn_vv(), 1);
    mmk_reset(fn_vv);

    int err = 0xfefefefe;
    mmk_mock("fn_ii", fn_ii_mock);
    mmk_when(fn_ii(1), .then_return = mmk_val(int, 1), .then_errno = err);
    mmk_when(fn_ii(mmk_eq(int, 2)), .then_return = mmk_val(int, 2), .then_errno = err + 1);
    mmk_when(fn_ii(mmk_ge(int, 3)), .then_return = mmk_val(int, 3), .then_errno = err + 2);
    mmk_when(fn_ii(mmk_gt(int, 4)), .then_return = mmk_val(int, 4), .then_errno = err + 3);
    mmk_when(fn_ii(mmk_le(int, -2)), .then_return = mmk_val(int, 5), .then_errno = err + 4);
    mmk_when(fn_ii(mmk_lt(int, -3)), .then_return = mmk_val(int, 6), .then_errno = err + 5);
    mmk_when(fn_ii(mmk_that(int, int_eq)), .then_return = mmk_val(int, 7), .then_errno = err + 6);

    mmk_assert(fn_ii(1) == 1 && errno == err);
    mmk_assert(fn_ii(2) == 2 && errno == err + 1);
    mmk_assert(fn_ii(3) == 3 && errno == err + 2);
    mmk_assert(fn_ii(4) == 3 && errno == err + 2);
    mmk_assert(fn_ii(5) == 4 && errno == err + 3);
    mmk_assert(fn_ii(6) == 4 && errno == err + 3);
    mmk_assert(fn_ii(INT_MAX)  == 4 && errno == err + 3);
    mmk_assert(fn_ii(-1) == 0);
    mmk_assert(fn_ii(-2) == 5 && errno == err + 4);
    mmk_assert(fn_ii(-3) == 5 && errno == err + 4);
    mmk_assert(fn_ii(-4) == 6 && errno == err + 5);
    mmk_assert(fn_ii(-5) == 6 && errno == err + 5);
    mmk_assert(fn_ii(INT_MIN) == 6 && errno == err + 5);

    expected_int = 1;
    mmk_assert(fn_ii(1) == 7 && errno == err + 6 && int_eq_called);
    int_eq_called = 0;

    check_called_exact(fn_ii(mmk_any(int)), 14);
    check_called_exact(fn_ii(1), 2);
    check_called_exact(fn_ii(2), 1);
    check_called_exact(fn_ii(3), 1);
    check_called_exact(fn_ii(4), 1);
    check_called_exact(fn_ii(5), 1);
    check_called_exact(fn_ii(6), 1);
    check_called_exact(fn_ii(INT_MAX), 1);
    check_called_exact(fn_ii(-1), 1);
    check_called_exact(fn_ii(-2), 1);
    check_called_exact(fn_ii(-3), 1);
    check_called_exact(fn_ii(-4), 1);
    check_called_exact(fn_ii(-5), 1);
    check_called_exact(fn_ii(INT_MIN), 1);
    check_called_exact(fn_ii(12), 0);
    mmk_reset(fn_ii);


    mmk_mock("fn_ii_va", fn_ii_va_mock);
    mmk_when(fn_ii_va(1, 42), .then_return = mmk_val(int, 1));

    mmk_assert(fn_ii_va(1, 42) == 1);

    mmk_reset(fn_ii_va);

    return 0;
}